

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O2

void __thiscall Refal2::CParser::parsingRule(CParser *this)

{
  CRuleParser::AddToken((CRuleParser *)this);
  checkFinished(this);
  return;
}

Assistant:

void CParser::parsingRule()
{
	CRuleParser::AddToken();
	checkFinished();
}